

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_php.cpp
# Opt level: O0

string * __thiscall
flatbuffers::php::PhpGenerator::GenGetter_abi_cxx11_
          (string *__return_storage_ptr__,PhpGenerator *this,Type *type)

{
  Type *type_00;
  allocator<char> local_51;
  undefined1 local_50 [35];
  allocator<char> local_2d [20];
  allocator<char> local_19 [9];
  Type *type_local;
  
  local_19._1_8_ = this;
  type_local = (Type *)__return_storage_ptr__;
  switch(*(undefined4 *)&(this->super_BaseGenerator)._vptr_BaseGenerator) {
  case 0xd:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"__string",local_19);
    std::allocator<char>::~allocator(local_19);
    break;
  case 0xe:
    Type::VectorType((Type *)local_50,(Type *)this);
    GenGetter_abi_cxx11_(__return_storage_ptr__,(PhpGenerator *)local_50,type_00);
    break;
  case 0xf:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"__struct",local_2d);
    std::allocator<char>::~allocator(local_2d);
    break;
  case 0x10:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"__union",(allocator<char> *)(local_50 + 0x22));
    std::allocator<char>::~allocator((allocator<char> *)(local_50 + 0x22));
    break;
  default:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"Get",&local_51);
    std::allocator<char>::~allocator(&local_51);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string GenGetter(const Type &type) {
    switch (type.base_type) {
      case BASE_TYPE_STRING: return "__string";
      case BASE_TYPE_STRUCT: return "__struct";
      case BASE_TYPE_UNION: return "__union";
      case BASE_TYPE_VECTOR: return GenGetter(type.VectorType());
      default: return "Get";
    }
  }